

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::InsertLabels(IRBuilder *this)

{
  byte bVar1;
  uint uVar2;
  Kind KVar3;
  SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Type pBVar5;
  BranchInstr *pBVar6;
  long *plVar7;
  code *pcVar8;
  bool bVar9;
  uint uVar10;
  uint32 byteCodeOffset;
  undefined4 *puVar11;
  Type *ppBVar12;
  JITLoopHeaderIDL *pJVar13;
  MultiBranchInstr *branchRef;
  long lVar14;
  LabelInstr *pLVar15;
  long *plVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  Iterator local_58;
  uint local_44;
  uint local_40;
  uint offset;
  IRBuilder *local_38;
  
  pSVar4 = this->branchRelocList;
  local_38 = this;
  if (pSVar4 == (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3c5,"(this->branchRelocList)","Malformed branch reloc list");
    if (!bVar9) {
LAB_004c811c:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar11 = 0;
    local_58.list =
         &local_38->branchRelocList->
          super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>;
    local_58.current = &(local_58.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  }
  else {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_58.list = &pSVar4->super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>;
    local_58.current = (NodeBase *)pSVar4;
  }
LAB_004c7cc1:
  if ((SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current ==
      (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar9) goto LAB_004c811c;
    *puVar11 = 0;
  }
  local_58.current =
       (((SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current)->
       super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>).
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_58.current ==
      local_58.list) {
    return;
  }
  ppBVar12 = SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_58);
  pBVar5 = *ppBVar12;
  pBVar6 = pBVar5->branchInstr;
  local_44 = pBVar5->offset;
  uVar2 = pBVar5->branchOffset;
  local_40 = local_44;
  bVar9 = JITTimeWorkItem::IsLoopBody(local_38->m_func->m_workItem);
  if ((bVar9) &&
     (pJVar13 = JITTimeWorkItem::GetLoopHeader(local_38->m_func->m_workItem),
     pJVar13->endOffset + 1 < local_40)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3d1,"(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset())",
                       "!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset()");
    if (!bVar9) goto LAB_004c811c;
    *puVar11 = 0;
  }
  if ((pBVar6->super_Instr).m_opcode == MultiBr) {
    if ((pBVar6->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar9) goto LAB_004c811c;
      *puVar11 = 0;
    }
    branchRef = IR::BranchInstr::AsMultiBrInstr(pBVar6);
    plVar7 = (long *)branchRef->m_branchTargets;
    if (plVar7 == (long *)0x0) {
      pLVar15 = (LabelInstr *)0x0;
      uVar10 = local_40;
    }
    else {
      KVar3 = branchRef->m_kind;
      if ((KVar3 == IntJumpTable) || (KVar3 == SingleCharStrJumpTable)) {
        plVar16 = plVar7 + 1;
        lVar18 = branchRef->m_baseCaseValue;
        if (lVar18 <= branchRef->m_lastCaseValue) {
          lVar14 = *plVar7;
          do {
            lVar20 = lVar14 + branchRef->m_baseCaseValue * -8;
            offset = Math::PointerCastToIntegral<unsigned_int>(*(void **)(lVar20 + lVar18 * 8));
            pLVar15 = CreateLabel(local_38,pBVar6,&offset);
            if (pLVar15 != (LabelInstr *)0x0) {
              IR::LabelInstr::AddLabelRef(pLVar15,&branchRef->super_BranchInstr);
            }
            *(LabelInstr **)(lVar20 + lVar18 * 8) = pLVar15;
            lVar18 = lVar18 + 1;
          } while (lVar18 <= branchRef->m_lastCaseValue);
        }
      }
      else if (KVar3 == StrDictionary) {
        plVar16 = plVar7 + 7;
        uVar10 = *(uint *)((long)plVar7 + 0x1c);
        if (uVar10 != 0) {
          uVar17 = 0;
          do {
            iVar19 = *(int *)(*plVar7 + uVar17 * 4);
            if (iVar19 != -1) {
              do {
                lVar18 = plVar7[1];
                lVar14 = (long)iVar19;
                iVar19 = *(int *)(lVar18 + 8 + lVar14 * 0x18);
                offset = Math::PointerCastToIntegral<unsigned_int>
                                   (*(void **)(lVar18 + lVar14 * 0x18));
                pLVar15 = CreateLabel(local_38,pBVar6,&offset);
                if (pLVar15 != (LabelInstr *)0x0) {
                  IR::LabelInstr::AddLabelRef(pLVar15,&branchRef->super_BranchInstr);
                }
                *(LabelInstr **)(lVar18 + lVar14 * 0x18) = pLVar15;
              } while (iVar19 != -1);
              uVar10 = *(uint *)((long)plVar7 + 0x1c);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < uVar10);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x435,"(false)","false");
        if (!bVar9) goto LAB_004c811c;
        *puVar11 = 0;
        plVar16 = (long *)0x0;
      }
      offset = Math::PointerCastToIntegral<unsigned_int>((void *)*plVar16);
      pLVar15 = CreateLabel(local_38,pBVar6,&offset);
      if (pLVar15 != (LabelInstr *)0x0) {
        IR::LabelInstr::AddLabelRef(pLVar15,&branchRef->super_BranchInstr);
      }
      *plVar16 = (long)pLVar15;
      uVar10 = local_40;
    }
  }
  else {
    pLVar15 = CreateLabel(local_38,pBVar6,&local_44);
    if (pBVar6->m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar9) goto LAB_004c811c;
      *puVar11 = 0;
    }
    if (pBVar6->m_branchTarget != (LabelInstr *)0x0) {
      IR::LabelInstr::RemoveLabelRef(pBVar6->m_branchTarget,pBVar6);
    }
    if (pLVar15 != (LabelInstr *)0x0) {
      IR::LabelInstr::AddLabelRef(pLVar15,pBVar6);
    }
    pBVar6->m_branchTarget = pLVar15;
    uVar10 = local_44;
  }
  if ((pBVar5->isNotBackEdge == false) && (uVar10 <= uVar2)) {
    bVar1 = pLVar15->field_0x78;
    pLVar15->field_0x78 = bVar1 | 1;
    bVar9 = Func::IsJitInDebugMode(local_38->m_func);
    if (bVar9) {
      pBVar6 = pBVar5->branchInstr;
      byteCodeOffset = IR::Instr::GetByteCodeOffset(&pBVar6->super_Instr);
      InsertBailOutForDebugger
                (local_38,byteCodeOffset,BailOutBreakPointInFunction|BailOutForceByFlag,
                 &pBVar6->super_Instr);
    }
    if (((bVar1 & 1) == 0) && (local_38->m_loopCounterSym != (StackSym *)0x0)) {
      InsertIncrLoopBodyLoopCounter(local_38,pLVar15);
    }
  }
  goto LAB_004c7cc1;
}

Assistant:

void
IRBuilder::InsertLabels()
{
    AssertMsg(this->branchRelocList, "Malformed branch reloc list");

    SList<BranchReloc *>::Iterator iter(this->branchRelocList);

    while (iter.Next())
    {
        IR::LabelInstr * labelInstr = nullptr;
        BranchReloc * reloc = iter.Data();
        IR::BranchInstr * branchInstr = reloc->GetBranchInstr();
        uint offset = reloc->GetOffset();
        uint const branchOffset = reloc->GetBranchOffset();

        Assert(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset());

        if(branchInstr->m_opcode == Js::OpCode::MultiBr)
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsBranchInstr()->AsMultiBrInstr();

            multiBranchInstr->UpdateMultiBrTargetOffsets([&](uint32 offset) -> IR::LabelInstr *
            {
                labelInstr = this->CreateLabel(branchInstr, offset);
                multiBranchInstr->ChangeLabelRef(nullptr, labelInstr);
                return labelInstr;
            });
        }
        else
        {
            labelInstr = this->CreateLabel(branchInstr, offset);
            branchInstr->SetTarget(labelInstr);
        }

        if (!reloc->IsNotBackEdge() && branchOffset >= offset)
        {
            bool wasLoopTop = labelInstr->m_isLoopTop;
            labelInstr->m_isLoopTop = true;

            if (m_func->IsJitInDebugMode())
            {
                // Add bailout for Async Break.
                IR::BranchInstr* backEdgeBranchInstr = reloc->GetBranchInstr();
                this->InsertBailOutForDebugger(backEdgeBranchInstr->GetByteCodeOffset(), IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction, backEdgeBranchInstr);
            }

            if (!wasLoopTop && m_loopCounterSym)
            {
                this->InsertIncrLoopBodyLoopCounter(labelInstr);
            }

        }
    }
}